

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Node<QString,_QMakeLocalFileName>::emplaceValue<QMakeLocalFileName>
          (Node<QString,_QMakeLocalFileName> *this,QMakeLocalFileName *args)

{
  qsizetype qVar1;
  qsizetype qVar2;
  QArrayData *pQVar3;
  QArrayData *pQVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  
  qVar1 = (args->real_name).d.size;
  (args->real_name).d.size = 0;
  qVar2 = (args->local_name).d.size;
  (args->local_name).d.size = 0;
  pDVar5 = (args->real_name).d.d;
  pcVar6 = (args->real_name).d.ptr;
  (args->real_name).d.d = (Data *)0x0;
  (args->real_name).d.ptr = (char16_t *)0x0;
  (this->value).real_name.d.size = qVar1;
  pDVar7 = (args->local_name).d.d;
  pcVar8 = (args->local_name).d.ptr;
  (args->local_name).d.d = (Data *)0x0;
  (args->local_name).d.ptr = (char16_t *)0x0;
  pQVar3 = &((this->value).real_name.d.d)->super_QArrayData;
  pQVar4 = &((this->value).local_name.d.d)->super_QArrayData;
  (this->value).real_name.d.d = pDVar5;
  (this->value).real_name.d.ptr = pcVar6;
  (this->value).local_name.d.d = pDVar7;
  (this->value).local_name.d.ptr = pcVar8;
  (this->value).local_name.d.size = qVar2;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }